

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i *palVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  __m128i *b;
  undefined8 *puVar15;
  __m128i *palVar16;
  uint uVar17;
  longlong extraout_RDX;
  __m128i *palVar18;
  int32_t in_R9D;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  __m128i a;
  __m128i c;
  __m128i c_00;
  __m128i vH_00;
  __m128i vH_01;
  int32_t in_stack_fffffffffffffb08;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i *pv_2;
  __m128i *pv_1;
  __m128i vCompare;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  parasail_result_t *result;
  longlong lStack_468;
  int32_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int32_t local_43c;
  int32_t score;
  __m128i vNegInf;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvE;
  __m128i *pvHMax;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_3b8;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_32","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_32","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_3b8 = 0;
    iVar14 = profile->s1Len;
    ppVar2 = profile->matrix;
    iVar12 = (iVar14 + 3) / 4;
    pvVar3 = (profile->profile32).score;
    lStack_468 = -0x3fffffff40000000;
    vMaxHUnit[0] = -0x3fffffff40000000;
    local_43c = -0x40000000;
    iVar13 = ppVar2->max;
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar12 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4400804;
      uVar17 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar17;
      *(uint *)&profile_local->field_0xc = uVar17;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar12);
      pvHMax = parasail_memalign___m128i(0x10,(long)iVar12);
      pvE = parasail_memalign___m128i(0x10,(long)iVar12);
      b = parasail_memalign___m128i(0x10,(long)iVar12);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMax == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        c[0] = (long)iVar12;
        c[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,c,len);
        c_00[0] = (long)iVar12;
        c_00[1]._0_4_ = -open;
        c_00[1]._4_4_ = 0;
        palVar18 = b;
        parasail_memset___m128i(b,c_00,(ulong)(uint)-open);
        vMaxHUnit[1] = lStack_468;
        vMaxH[0] = vMaxHUnit[0];
        for (end_query = 0; palVar11 = pvHLoad, palVar16 = pvE, end_query < s2Len;
            end_query = end_query + 1) {
          vH[1] = 0;
          vF[0] = 0;
          vH_01[0] = pvHLoad[iVar12 + -1][0];
          vP = (__m128i *)(vH_01[0] << 0x20);
          vH[0] = pvHLoad[iVar12 + -1][1] << 0x20 | vH_01[0] >> 0x20;
          vH_01[0] = (ulong)end_query;
          iVar1 = ppVar2->mapper[(byte)s2[vH_01[0]]];
          if (local_3b8 == end_query + -2) {
            pvE = pvHMax;
            pvHLoad = palVar16;
          }
          else {
            pvHLoad = pvHMax;
          }
          pvHMax = palVar11;
          for (k = 0; k < iVar12; k = k + 1) {
            puVar15 = (undefined8 *)((long)pvVar3 + (long)k * 0x10 + (long)(iVar1 * iVar12) * 0x10);
            uVar5 = *puVar15;
            uVar6 = puVar15[1];
            local_318 = (int)vP;
            iStack_314 = (int)((ulong)vP >> 0x20);
            iStack_310 = (int)vH[0];
            iStack_30c = (int)((ulong)vH[0] >> 0x20);
            local_328 = (int)uVar5;
            iStack_324 = (int)((ulong)uVar5 >> 0x20);
            iStack_320 = (int)uVar6;
            iStack_31c = (int)((ulong)uVar6 >> 0x20);
            local_318 = local_318 + local_328;
            iStack_314 = iStack_314 + iStack_324;
            iStack_310 = iStack_310 + iStack_320;
            iStack_30c = iStack_30c + iStack_31c;
            lVar7 = b[k][0];
            lVar8 = b[k][1];
            local_228 = (int)lVar7;
            iStack_224 = (int)((ulong)lVar7 >> 0x20);
            iStack_220 = (int)lVar8;
            iStack_21c = (int)((ulong)lVar8 >> 0x20);
            uVar17 = (uint)(local_318 < local_228) * local_228 |
                     (uint)(local_318 >= local_228) * local_318;
            uVar20 = (uint)(iStack_314 < iStack_224) * iStack_224 |
                     (uint)(iStack_314 >= iStack_224) * iStack_314;
            uVar22 = (uint)(iStack_310 < iStack_220) * iStack_220 |
                     (uint)(iStack_310 >= iStack_220) * iStack_310;
            uVar24 = (uint)(iStack_30c < iStack_21c) * iStack_21c |
                     (uint)(iStack_30c >= iStack_21c) * iStack_30c;
            local_248 = (int)vH[1];
            iStack_244 = (int)((ulong)vH[1] >> 0x20);
            iStack_240 = (int)vF[0];
            iStack_23c = (int)((ulong)vF[0] >> 0x20);
            uVar17 = (uint)((int)uVar17 < local_248) * local_248 |
                     ((int)uVar17 >= local_248) * uVar17;
            uVar20 = (uint)((int)uVar20 < iStack_244) * iStack_244 |
                     ((int)uVar20 >= iStack_244) * uVar20;
            uVar22 = (uint)((int)uVar22 < iStack_240) * iStack_240 |
                     ((int)uVar22 >= iStack_240) * uVar22;
            uVar24 = (uint)((int)uVar24 < iStack_23c) * iStack_23c |
                     ((int)uVar24 >= iStack_23c) * uVar24;
            iVar19 = (-1 < (int)uVar17) * uVar17;
            iVar21 = (-1 < (int)uVar20) * uVar20;
            iVar23 = (-1 < (int)uVar22) * uVar22;
            iVar25 = (-1 < (int)uVar24) * uVar24;
            vP = (__m128i *)CONCAT44(iVar21,iVar19);
            vH[0] = CONCAT44(iVar25,iVar23);
            pvHLoad[k][0] = (longlong)vP;
            pvHLoad[k][1] = vH[0];
            palVar18 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar12;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)palVar18,vH_00,end_query,s2Len,in_R9D,in_stack_fffffffffffffb08);
            local_288 = (int)vMaxHUnit[1];
            iStack_284 = (int)((ulong)vMaxHUnit[1] >> 0x20);
            iStack_280 = (int)vMaxH[0];
            iStack_27c = (int)((ulong)vMaxH[0] >> 0x20);
            vMaxHUnit[1] = CONCAT44((uint)(iVar21 < iStack_284) * iStack_284 |
                                    (uint)(iVar21 >= iStack_284) * iVar21,
                                    (uint)(iVar19 < local_288) * local_288 |
                                    (uint)(iVar19 >= local_288) * iVar19);
            vMaxH[0] = CONCAT44((uint)(iVar25 < iStack_27c) * iStack_27c |
                                (uint)(iVar25 >= iStack_27c) * iVar25,
                                (uint)(iVar23 < iStack_280) * iStack_280 |
                                (uint)(iVar23 >= iStack_280) * iVar23);
            iVar19 = iVar19 - open;
            iVar21 = iVar21 - open;
            iVar23 = iVar23 - open;
            iVar25 = iVar25 - open;
            local_228 = local_228 - gap;
            iStack_224 = iStack_224 - gap;
            iStack_220 = iStack_220 - gap;
            iStack_21c = iStack_21c - gap;
            vF[1] = CONCAT44((uint)(iStack_224 < iVar21) * iVar21 |
                             (uint)(iStack_224 >= iVar21) * iStack_224,
                             (uint)(local_228 < iVar19) * iVar19 |
                             (uint)(local_228 >= iVar19) * local_228);
            vE[0] = CONCAT44((uint)(iStack_21c < iVar25) * iVar25 |
                             (uint)(iStack_21c >= iVar25) * iStack_21c,
                             (uint)(iStack_220 < iVar23) * iVar23 |
                             (uint)(iStack_220 >= iVar23) * iStack_220);
            b[k][0] = vF[1];
            b[k][1] = vE[0];
            local_248 = local_248 - gap;
            iStack_244 = iStack_244 - gap;
            iStack_240 = iStack_240 - gap;
            iStack_23c = iStack_23c - gap;
            vH[1] = CONCAT44((uint)(iStack_244 < iVar21) * iVar21 |
                             (uint)(iStack_244 >= iVar21) * iStack_244,
                             (uint)(local_248 < iVar19) * iVar19 |
                             (uint)(local_248 >= iVar19) * local_248);
            vF[0] = CONCAT44((uint)(iStack_23c < iVar25) * iVar25 |
                             (uint)(iStack_23c >= iVar25) * iStack_23c,
                             (uint)(iStack_240 < iVar23) * iVar23 |
                             (uint)(iStack_240 >= iVar23) * iStack_240);
            palVar16 = palVar11 + k;
            vP = (__m128i *)(*palVar16)[0];
            vH[0] = (*palVar16)[1];
            vH_01[0] = vH_00[0];
          }
          for (end_ref = 0; end_ref < 4; end_ref = end_ref + 1) {
            vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20;
            for (k = 0; k < iVar12; k = k + 1) {
              lVar7 = pvHLoad[k][0];
              lVar8 = pvHLoad[k][1];
              local_2d8 = (int)lVar7;
              iStack_2d4 = (int)((ulong)lVar7 >> 0x20);
              iStack_2d0 = (int)lVar8;
              iStack_2cc = (int)((ulong)lVar8 >> 0x20);
              local_2e8 = (int)vH[1];
              iStack_2e4 = (int)((ulong)vH[1] >> 0x20);
              iStack_2e0 = (int)vF[0];
              iStack_2dc = (int)((ulong)vF[0] >> 0x20);
              uVar17 = (uint)(local_2d8 < local_2e8) * local_2e8 |
                       (uint)(local_2d8 >= local_2e8) * local_2d8;
              uVar20 = (uint)(iStack_2d4 < iStack_2e4) * iStack_2e4 |
                       (uint)(iStack_2d4 >= iStack_2e4) * iStack_2d4;
              uVar22 = (uint)(iStack_2d0 < iStack_2e0) * iStack_2e0 |
                       (uint)(iStack_2d0 >= iStack_2e0) * iStack_2d0;
              uVar24 = (uint)(iStack_2cc < iStack_2dc) * iStack_2dc |
                       (uint)(iStack_2cc >= iStack_2dc) * iStack_2cc;
              vP = (__m128i *)CONCAT44(uVar20,uVar17);
              vH[0] = CONCAT44(uVar24,uVar22);
              pvHLoad[k][0] = (longlong)vP;
              pvHLoad[k][1] = vH[0];
              palVar18 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = iVar12;
              vH_01[1]._4_4_ = 0;
              arr_store_si128((int *)palVar18,vH_01,end_query,s2Len,in_R9D,in_stack_fffffffffffffb08
                             );
              local_308 = (int)vMaxHUnit[1];
              iStack_304 = (int)((ulong)vMaxHUnit[1] >> 0x20);
              iStack_300 = (int)vMaxH[0];
              iStack_2fc = (int)((ulong)vMaxH[0] >> 0x20);
              vMaxHUnit[1] = CONCAT44((uint)((int)uVar20 < iStack_304) * iStack_304 |
                                      ((int)uVar20 >= iStack_304) * uVar20,
                                      (uint)((int)uVar17 < local_308) * local_308 |
                                      ((int)uVar17 >= local_308) * uVar17);
              vMaxH[0] = CONCAT44((uint)((int)uVar24 < iStack_2fc) * iStack_2fc |
                                  ((int)uVar24 >= iStack_2fc) * uVar24,
                                  (uint)((int)uVar22 < iStack_300) * iStack_300 |
                                  ((int)uVar22 >= iStack_300) * uVar22);
              iStack_2dc = iStack_2dc - gap;
              vH[1] = CONCAT44(iStack_2e4 - gap,local_2e8 - gap);
              vF[0] = CONCAT44(iStack_2dc,iStack_2e0 - gap);
              bVar4 = (int)(uVar24 - open) < iStack_2dc;
              uVar24 = -(uint)bVar4;
              auVar10._4_4_ = -(uint)((int)(uVar20 - open) < iStack_2e4 - gap);
              auVar10._0_4_ = -(uint)((int)(uVar17 - open) < local_2e8 - gap);
              auVar10._8_4_ = -(uint)((int)(uVar22 - open) < iStack_2e0 - gap);
              auVar10._12_4_ = uVar24;
              if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar10 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar10 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar10 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar10 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar10 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar10 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar10 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar10 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar10 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar10 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (uVar24 >> 7 & 1) == 0) && (uVar24 >> 0xf & 1) == 0) &&
                  (uVar24 >> 0x17 & 1) == 0) && !bVar4) goto LAB_009957ac;
            }
          }
LAB_009957ac:
          local_d8 = (int)vMaxHUnit[1];
          iStack_d4 = (int)((ulong)vMaxHUnit[1] >> 0x20);
          iStack_d0 = (int)vMaxH[0];
          iStack_cc = (int)((ulong)vMaxH[0] >> 0x20);
          local_e8 = (int)lStack_468;
          iStack_e4 = (int)((ulong)lStack_468 >> 0x20);
          iStack_e0 = (int)vMaxHUnit[0];
          iStack_dc = (int)((ulong)vMaxHUnit[0] >> 0x20);
          uVar17 = -(uint)(iStack_e0 < iStack_d0);
          uVar20 = -(uint)(iStack_dc < iStack_cc);
          auVar9._4_4_ = -(uint)(iStack_e4 < iStack_d4);
          auVar9._0_4_ = -(uint)(local_e8 < local_d8);
          auVar9._12_4_ = uVar20;
          auVar9._8_4_ = uVar17;
          if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar9 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar9 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar9 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar9 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar9 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar17 & 0x80) != 0) || (uVar17 & 0x8000) != 0) || (uVar17 & 0x800000) != 0) ||
                 uVar17 != 0) || (uVar20 >> 7 & 1) != 0) || (uVar20 >> 0xf & 1) != 0) ||
              (uVar20 >> 0x17 & 1) != 0) || iStack_dc < iStack_cc) {
            a[1] = vH_01[0];
            a[0] = (longlong)palVar18;
            local_43c = _mm_hmax_epi32_rpl(a);
            if (0x7fffffff - (iVar13 + 1) < local_43c) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            lStack_468 = CONCAT44(local_43c,local_43c);
            vMaxHUnit[0] = CONCAT44(local_43c,local_43c);
            local_3b8 = end_query;
          }
        }
        palVar18 = pvE;
        if (local_43c == 0x7fffffff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar13 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar13 == 0) {
          if (local_3b8 == end_query + -1) {
            pvE = pvHLoad;
            pvHLoad = palVar18;
          }
          else if (local_3b8 == end_query + -2) {
            pvE = pvHMax;
            pvHMax = palVar18;
          }
          _temp = pvE;
          s1Len = iVar14 + -1;
          for (k = 0; k < iVar12 * 4; k = k + 1) {
            if (((int)(*_temp)[0] == local_43c) &&
               (iVar14 = k / 4 + (k % 4) * iVar12, iVar14 < s1Len)) {
              s1Len = iVar14;
            }
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        else {
          local_43c = 0x7fffffff;
          s1Len = 0;
          local_3b8 = 0;
        }
        *(int32_t *)&profile_local->s1 = local_43c;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_3b8;
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHMax);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            vH = _mm_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi32(vH, vMaxH);
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}